

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall
cmParsePHPCoverage::ReadCoverageArray(cmParsePHPCoverage *this,istream *in,string *fileName)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  long *plVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  value_type_conflict2 local_528;
  int local_524;
  int local_520;
  int value;
  int line;
  int i;
  ostringstream local_4f8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream cmCTestLog_msg_1;
  int local_1e4;
  string local_1e0 [4];
  int size;
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  char local_35 [3];
  undefined1 local_32;
  char local_31;
  char buf [4];
  mapped_type *pmStack_30;
  char c;
  SingleFileCoverageVector *coverageVector;
  string *fileName_local;
  istream *in_local;
  cmParsePHPCoverage *this_local;
  
  pmStack_30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,fileName);
  std::istream::read((char *)in,(long)local_35);
  local_32 = 0;
  iVar3 = strcmp(local_35,";a:");
  if (iVar3 == 0) {
    local_1e4 = 0;
    bVar2 = ReadInt(this,in,&local_1e4);
    if (bVar2) {
      plVar6 = (long *)std::istream::get((char *)in);
      uVar7 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if (((uVar7 & 1) == 0) || (local_31 != '{')) {
        for (value = 0; value < local_1e4; value = value + 1) {
          ReadUntil(this,in,':');
          local_520 = 0;
          ReadInt(this,in,&local_520);
          local_520 = local_520 + -1;
          if (local_520 < 0) {
            local_520 = 0;
          }
          ReadUntil(this,in,':');
          local_524 = 0;
          ReadInt(this,in,&local_524);
          while (sVar8 = std::vector<int,_std::allocator<int>_>::size(pmStack_30),
                sVar8 <= (ulong)(long)local_520) {
            local_528 = -1;
            std::vector<int,_std::allocator<int>_>::push_back(pmStack_30,&local_528);
          }
          if (local_524 < 0) {
            local_524 = 0;
          }
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pmStack_30,(long)local_520);
          iVar3 = local_524;
          if (*pvVar9 == -1) {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pmStack_30,(long)local_520);
            *pvVar9 = iVar3;
          }
          else {
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pmStack_30,(long)local_520);
            *pvVar9 = iVar3 + *pvVar9;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_4f8);
        std::operator<<((ostream *)local_4f8,"failed to read open {\n");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                     ,0x3b,pcVar5,false);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::ostringstream::~ostringstream(local_4f8);
        this_local._7_1_ = false;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_360);
      std::operator<<((ostream *)local_360,"failed to read size ");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                   ,0x37,pcVar5,false);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,"failed to read start of coverage array, found : "
                            );
    poVar4 = std::operator<<(poVar4,local_35);
    std::operator<<(poVar4,"\n");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x32,pcVar5,false);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmParsePHPCoverage::ReadCoverageArray(std::istream& in,
                                           std::string const& fileName)
{
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
    this->Coverage.TotalCoverage[fileName];

  char c;
  char buf[4];
  in.read(buf, 3);
  buf[3] = 0;
  if (strcmp(buf, ";a:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of coverage array, found : " << buf
                                                                  << "\n");
    return false;
  }
  int size = 0;
  if (!this->ReadInt(in, size)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read size ");
    return false;
  }
  if (!in.get(c) && c == '{') {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read open {\n");
    return false;
  }
  for (int i = 0; i < size; i++) {
    this->ReadUntil(in, ':');
    int line = 0;
    this->ReadInt(in, line);
    // ok xdebug may have a bug here
    // it seems to be 1 based but often times
    // seems to have a 0'th line.
    line--;
    if (line < 0) {
      line = 0;
    }
    this->ReadUntil(in, ':');
    int value = 0;
    this->ReadInt(in, value);
    // make sure the vector is the right size and is
    // initialized with -1 for each line
    while (coverageVector.size() <= static_cast<size_t>(line)) {
      coverageVector.push_back(-1);
    }
    // if value is less than 0, set it to zero
    // TODO figure out the difference between
    // -1 and -2 in xdebug coverage??  For now
    // assume less than 0 is just not covered
    // CDash expects -1 for non executable code (like comments)
    // and 0 for uncovered code, and a positive value
    // for number of times a line was executed
    if (value < 0) {
      value = 0;
    }
    // if unset then set it to value
    if (coverageVector[line] == -1) {
      coverageVector[line] = value;
    }
    // otherwise increment by value
    else {
      coverageVector[line] += value;
    }
  }
  return true;
}